

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs.c
# Opt level: O2

int uv_fs_read(uv_loop_t *loop,uv_fs_t *req,uv_file file,uv_buf_t *bufs,uint nbufs,int64_t off,
              uv_fs_cb cb)

{
  long *plVar1;
  void *pvVar2;
  int iVar3;
  uv_buf_t *__dest;
  
  if (nbufs == 0 || bufs == (uv_buf_t *)0x0) {
    iVar3 = -0x16;
  }
  else {
    req->type = UV_FS;
    if (cb != (uv_fs_cb)0x0) {
      req->active_queue[0] = loop->active_reqs;
      plVar1 = (long *)loop->active_reqs[1];
      req->active_queue[1] = plVar1;
      *plVar1 = (long)req->active_queue;
      loop->active_reqs[1] = req->active_queue;
    }
    req->fs_type = UV_FS_READ;
    req->result = 0;
    req->ptr = (void *)0x0;
    req->loop = loop;
    req->path = (char *)0x0;
    req->new_path = (char *)0x0;
    req->cb = cb;
    req->file = file;
    req->nbufs = nbufs;
    __dest = req->bufsml;
    req->bufs = __dest;
    if (4 < nbufs) {
      __dest = (uv_buf_t *)uv__malloc((ulong)nbufs << 4);
      req->bufs = __dest;
      if (__dest == (uv_buf_t *)0x0) {
        if (cb == (uv_fs_cb)0x0) {
          return -0xc;
        }
        if (loop->active_reqs != (void **)loop->active_reqs[0]) {
          pvVar2 = req->active_queue[0];
          *(void **)req->active_queue[1] = pvVar2;
          *(void **)((long)pvVar2 + 8) = req->active_queue[1];
          return -0xc;
        }
        __assert_fail("uv__has_active_reqs(loop)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/czanyou[P]node/deps/libuv/src/unix/fs.c"
                      ,0x4b2,
                      "int uv_fs_read(uv_loop_t *, uv_fs_t *, uv_file, const uv_buf_t *, unsigned int, int64_t, uv_fs_cb)"
                     );
      }
    }
    memcpy(__dest,bufs,(ulong)nbufs << 4);
    req->off = off;
    if (cb == (uv_fs_cb)0x0) {
      uv__fs_work(&req->work_req);
      iVar3 = (int)req->result;
    }
    else {
      uv__work_submit(loop,&req->work_req,uv__fs_work,uv__fs_done);
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

int uv_fs_read(uv_loop_t* loop, uv_fs_t* req,
               uv_file file,
               const uv_buf_t bufs[],
               unsigned int nbufs,
               int64_t off,
               uv_fs_cb cb) {
  INIT(READ);

  if (bufs == NULL || nbufs == 0)
    return UV_EINVAL;

  req->file = file;

  req->nbufs = nbufs;
  req->bufs = req->bufsml;
  if (nbufs > ARRAY_SIZE(req->bufsml))
    req->bufs = uv__malloc(nbufs * sizeof(*bufs));

  if (req->bufs == NULL)
    return UV_ENOMEM;

  memcpy(req->bufs, bufs, nbufs * sizeof(*bufs));

  req->off = off;
  POST;
}